

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientKeepAlive.cpp
# Opt level: O2

void __thiscall
ki::protocol::control::ClientKeepAlive::read_from(ClientKeepAlive *this,istream *istream)

{
  Field<unsigned_short> *pFVar1;
  Field<unsigned_short> *pFVar2;
  Field<unsigned_short> *pFVar3;
  string sStack_278;
  string local_258;
  string local_238 [2];
  Record record;
  ostringstream oss;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)local_238,"m_session_id",(allocator *)&oss);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&record,local_238,true);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::string((string *)&local_258,"m_milliseconds",(allocator *)&oss);
  pFVar2 = ki::dml::Record::add_field<unsigned_short>(&record,&local_258,true);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&sStack_278,"m_minutes",(allocator *)&oss);
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(&record,&sStack_278,true);
  std::__cxx11::string::~string((string *)&sStack_278);
  ki::dml::Record::read_from(&record,istream);
  this->m_session_id = pFVar1->m_value;
  this->m_milliseconds = pFVar2->m_value;
  this->m_minutes = pFVar3->m_value;
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void ClientKeepAlive::read_from(std::istream &istream)
	{
		dml::Record record;
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		auto *milliseconds = record.add_field<dml::USHRT>("m_milliseconds");
		auto *minutes = record.add_field<dml::USHRT>("m_minutes");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading ClientKeepAlive payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_session_id = session_id->get_value();
		m_milliseconds = milliseconds->get_value();
		m_minutes = minutes->get_value();
	}